

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

void google::protobuf::anon_unknown_25::ToUint128(Duration *value,uint128 *result,bool *negative)

{
  uint uVar1;
  uint64 uVar2;
  uint128 uVar3;
  uint128 local_28;
  
  uVar2 = value->seconds_;
  if (((long)uVar2 < 0) || (value->nanos_ < 0)) {
    *negative = true;
    result->lo_ = -uVar2;
    result->hi_ = 0;
    local_28.lo_ = 1000000000;
    local_28.hi_ = 0;
    uVar3 = operator*(result,&local_28);
    uVar1 = -value->nanos_;
  }
  else {
    *negative = false;
    result->lo_ = uVar2;
    result->hi_ = 0;
    local_28.lo_ = 1000000000;
    local_28.hi_ = 0;
    uVar3 = operator*(result,&local_28);
    uVar1 = value->nanos_;
  }
  *result = (uint128)((undefined1  [16])uVar3 + ZEXT416(uVar1));
  return;
}

Assistant:

void ToUint128(const Duration& value, uint128* result, bool* negative) {
  if (value.seconds() < 0 || value.nanos() < 0) {
    *negative = true;
    *result = static_cast<uint64>(-value.seconds());
    *result = *result * kNanosPerSecond + static_cast<uint32>(-value.nanos());
  } else {
    *negative = false;
    *result = static_cast<uint64>(value.seconds());
    *result = *result * kNanosPerSecond + static_cast<uint32>(value.nanos());
  }
}